

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::vector<Token,_std::allocator<Token>_>_> * __thiscall
Parser::extractMacroParameter
          (optional<std::vector<Token,_std::allocator<Token>_>_> *__return_storage_ptr__,
          Parser *this,Token *macroStart)

{
  Tokenizer *pTVar1;
  TokenizerPosition start;
  Token *pTVar2;
  size_type sVar3;
  undefined1 local_60 [8];
  vector<Token,_std::allocator<Token>_> tokens;
  TokenizerPosition endPos;
  int local_34;
  TokenType type;
  int bracketCount;
  int braceCount;
  int parenCount;
  TokenizerPosition startPos;
  Token *macroStart_local;
  Parser *this_local;
  
  pTVar1 = getTokenizer(this);
  start = Tokenizer::getPosition(pTVar1);
  bracketCount = 0;
  type = Invalid;
  local_34 = 0;
  while (pTVar2 = peekToken(this,0), pTVar2->type != Separator) {
    pTVar2 = peekToken(this,0);
    if ((((pTVar2->type == Comma) && (bracketCount == 0)) && (type == Invalid)) && (local_34 == 0))
    break;
    switch(pTVar2->type) {
    case LParen:
      bracketCount = bracketCount + 1;
      break;
    case RParen:
      bracketCount = bracketCount + -1;
      break;
    default:
      break;
    case LBrack:
      local_34 = local_34 + 1;
      break;
    case RBrack:
      local_34 = local_34 + -1;
      break;
    case LBrace:
      type = type + Identifier;
      break;
    case RBrace:
      type = type - Identifier;
    }
    eatToken(this);
  }
  if (bracketCount == 0) {
    pTVar1 = getTokenizer(this);
    tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)Tokenizer::getPosition(pTVar1);
    pTVar1 = getTokenizer(this);
    Tokenizer::getTokens
              ((vector<Token,_std::allocator<Token>_> *)local_60,pTVar1,start,
               (TokenizerPosition)
               tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    sVar3 = std::vector<Token,_std::allocator<Token>_>::size
                      ((vector<Token,_std::allocator<Token>_> *)local_60);
    if (sVar3 == 0) {
      printError<>(this,macroStart,"Empty macro argument");
      std::optional<std::vector<Token,_std::allocator<Token>_>_>::optional(__return_storage_ptr__);
    }
    else {
      std::optional<std::vector<Token,_std::allocator<Token>_>_>::
      optional<std::vector<Token,_std::allocator<Token>_>,_true>
                (__return_storage_ptr__,(vector<Token,_std::allocator<Token>_> *)local_60);
    }
    std::vector<Token,_std::allocator<Token>_>::~vector
              ((vector<Token,_std::allocator<Token>_> *)local_60);
  }
  else {
    printError<>(this,macroStart,"Unbalanced parentheses in macro parameter");
    std::optional<std::vector<Token,_std::allocator<Token>_>_>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<Token>> Parser::extractMacroParameter(const Token &macroStart)
{
	TokenizerPosition startPos = getTokenizer()->getPosition();

	// Find the end of the parameter. The parameter may contain expressions with function calls,
	// so keep track of the current parenthesis depth level
	int parenCount = 0;
	int braceCount = 0;
	int bracketCount = 0;

	while (peekToken().type != TokenType::Separator)
	{
		// if the next token is a comma, only exit the loop if parentheses are balanced
		auto type = peekToken().type;
		if (type == TokenType::Comma && parenCount == 0 && braceCount == 0 && bracketCount == 0)
			break;

		// keep track of parenthesis depth
		switch (type)
		{
		case TokenType::LParen:
			++parenCount;
			break;
		case TokenType::RParen:
			--parenCount;
			break;
		case TokenType::LBrace:
			++braceCount;
			break;
		case TokenType::RBrace:
			--braceCount;
			break;
		case TokenType::LBrack:
			++bracketCount;
			break;
		case TokenType::RBrack:
			--bracketCount;
			break;
		default:
			break;
		}

		eatToken();
	}

	if (parenCount != 0)
	{
		printError(macroStart, "Unbalanced parentheses in macro parameter");
		return std::nullopt;
	}

	TokenizerPosition endPos = getTokenizer()->getPosition();
	std::vector<Token> tokens = getTokenizer()->getTokens(startPos,endPos);
	if (tokens.size() == 0)
	{
		printError(macroStart, "Empty macro argument");
		return std::nullopt;
	}

	return tokens;
}